

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O0

void __thiscall
vkt::compute::anon_unknown_0::BufferToBufferInvertTest::BufferToBufferInvertTest
          (BufferToBufferInvertTest *this,TestContext *testCtx,string *name,string *description,
          deUint32 numValues,IVec3 *localSize,IVec3 *workSize,BufferType bufferType)

{
  IVec3 *localSize_local;
  deUint32 numValues_local;
  string *description_local;
  string *name_local;
  TestContext *testCtx_local;
  BufferToBufferInvertTest *this_local;
  
  TestCase::TestCase(&this->super_TestCase,testCtx,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BufferToBufferInvertTest_016ae630;
  this->m_bufferType = bufferType;
  this->m_numValues = numValues;
  tcu::Vector<int,_3>::Vector(&this->m_localSize,localSize);
  tcu::Vector<int,_3>::Vector(&this->m_workSize,workSize);
  return;
}

Assistant:

BufferToBufferInvertTest::BufferToBufferInvertTest (tcu::TestContext&	testCtx,
													const std::string&	name,
													const std::string&	description,
													const deUint32		numValues,
													const tcu::IVec3&	localSize,
													const tcu::IVec3&	workSize,
													const BufferType	bufferType)
	: TestCase		(testCtx, name, description)
	, m_bufferType	(bufferType)
	, m_numValues	(numValues)
	, m_localSize	(localSize)
	, m_workSize	(workSize)
{
	DE_ASSERT(m_numValues % (multiplyComponents(m_workSize) * multiplyComponents(m_localSize)) == 0);
	DE_ASSERT(m_bufferType == BUFFER_TYPE_UNIFORM || m_bufferType == BUFFER_TYPE_SSBO);
}